

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fft_world.cc
# Opt level: O3

void sptk::world::fft_destroy_plan(fft_plan p)

{
  if (p.out != (double *)0x0) {
    operator_delete__(p.out);
  }
  if (p.input != (double *)0x0) {
    operator_delete__(p.input);
  }
  if (p.ip != (int *)0x0) {
    operator_delete__(p.ip);
    return;
  }
  return;
}

Assistant:

void fft_destroy_plan(fft_plan p) {
  p.n = 0;
  p.in = NULL;
  p.c_in = NULL;
  p.out = NULL;
  p.c_out = NULL;
  p.sign = 0;
  p.flags = 0;
  delete[] p.input;
  delete[] p.ip;
  delete[] p.w;
}